

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

bool * __thiscall gguf_kv::get_val<bool>(gguf_kv *this,size_t i)

{
  pointer pcVar1;
  size_t sVar2;
  char *pcVar3;
  int line;
  ulong uVar4;
  
  if (this->type == GGUF_TYPE_BOOL) {
    sVar2 = gguf_type_size(GGUF_TYPE_UINT8);
    pcVar1 = (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)pcVar1;
    if (uVar4 % sVar2 == 0) {
      if (sVar2 * (i + 1) <= uVar4) {
        return (bool *)(pcVar1 + i);
      }
      pcVar3 = "data.size() >= (i+1)*type_size";
      line = 0xbe;
    }
    else {
      pcVar3 = "data.size() % type_size == 0";
      line = 0xbd;
    }
  }
  else {
    pcVar3 = "type_to_gguf_type<T>::value == type";
    line = 0xb7;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

const T & get_val(const size_t i = 0) const {
        GGML_ASSERT(type_to_gguf_type<T>::value == type);
        if constexpr (std::is_same<T, std::string>::value) {
            GGML_ASSERT(data_string.size() >= i+1);
            return data_string[i];
        }
        const size_t type_size = gguf_type_size(type);
        GGML_ASSERT(data.size() % type_size == 0);
        GGML_ASSERT(data.size() >= (i+1)*type_size);
        return reinterpret_cast<const T *>(data.data())[i];
    }